

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t flatcc_builder_end_vector(flatcc_builder_t *B)

{
  flatcc_builder_ref_t vector_ref;
  flatcc_builder_t *B_local;
  
  if (B->frame->type == 4) {
    B_local._4_4_ =
         flatcc_builder_create_vector
                   (B,B->ds,(ulong)(B->frame->container).table.pl_end,
                    (ulong)(B->frame->container).table.vs_end,B->align,
                    (ulong)(B->frame->container).table.vt_hash);
    if (B_local._4_4_ == 0) {
      B_local._4_4_ = 0;
    }
    else {
      exit_frame(B);
    }
    return B_local._4_4_;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x595,"flatcc_builder_ref_t flatcc_builder_end_vector(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_vector(flatcc_builder_t *B)
{
    flatcc_builder_ref_t vector_ref;

    check(frame(type) == flatcc_builder_vector, "expected vector frame");

    if (0 == (vector_ref = flatcc_builder_create_vector(B, B->ds,
            frame(container.vector.count), frame(container.vector.elem_size),
            B->align, frame(container.vector.max_count)))) {
        return 0;
    }
    exit_frame(B);
    return vector_ref;
}